

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zeDriverGet(uint32_t *pCount,ze_driver_handle_t *phDrivers)

{
  bool bVar1;
  vector<loader::driver_t,_std::allocator<loader::driver_t>_> *this;
  object_t<_ze_driver_handle_t_*> *poVar2;
  bad_alloc *anon_var_0;
  dditable_t *local_60;
  uint local_54;
  uint local_50;
  uint32_t driver_index;
  uint32_t i;
  uint32_t library_driver_handle_count;
  driver_t *drv;
  iterator __end1;
  iterator __begin1;
  driver_vector_t *__range1;
  uint local_20;
  ze_result_t local_1c;
  uint32_t total_driver_handle_count;
  ze_result_t result;
  ze_driver_handle_t *phDrivers_local;
  uint32_t *pCount_local;
  
  local_1c = ZE_RESULT_SUCCESS;
  local_20 = 0;
  _total_driver_handle_count = phDrivers;
  phDrivers_local = (ze_driver_handle_t *)pCount;
  bVar1 = std::atomic<bool>::exchange((atomic<bool> *)(context + 0x165c),true,memory_order_seq_cst);
  if ((!bVar1) && ((*(byte *)(context + 0x165d) & 1) == 0)) {
    std::call_once<loader::zeDriverGet(unsigned_int*,_ze_driver_handle_t**)::__0>
              ((once_flag *)(context + 0x1654),(anon_class_1_0_00000001 *)((long)&__range1 + 7));
    std::atomic<bool>::store((atomic<bool> *)(context + 0x165c),false,memory_order_seq_cst);
  }
  this = (vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)(context + 0x15e0);
  __end1 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::begin(this);
  drv = (driver_t *)std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::end(this);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
                                     *)&drv), bVar1) {
    _i = __gnu_cxx::
         __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
         ::operator*(&__end1);
    if (_i->initStatus == ZE_RESULT_SUCCESS) {
      if ((*(int *)phDrivers_local != 0) && (*(uint *)phDrivers_local == local_20)) break;
      driver_index = 0;
      local_1c = (*(_i->dditable).ze.Driver.pfnGet)(&driver_index,(ze_driver_handle_t *)0x0);
      if (local_1c == ZE_RESULT_SUCCESS) {
        if ((_total_driver_handle_count != (ze_driver_handle_t *)0x0) &&
           (*(int *)phDrivers_local != 0)) {
          if (*(uint *)phDrivers_local < local_20 + driver_index) {
            driver_index = *(int *)phDrivers_local - local_20;
          }
          local_1c = (*(_i->dditable).ze.Driver.pfnGet)
                               (&driver_index,_total_driver_handle_count + local_20);
          if (local_1c != ZE_RESULT_SUCCESS) break;
          _i->driverInuse = true;
          for (local_50 = 0; local_50 < driver_index; local_50 = local_50 + 1) {
            local_54 = local_20 + local_50;
            local_60 = &_i->dditable;
            poVar2 = singleton_factory_t<object_t<_ze_driver_handle_t*>,_ze_driver_handle_t*>::
                     getInstance<_ze_driver_handle_t*&,dditable_t*>
                               ((singleton_factory_t<object_t<_ze_driver_handle_t*>,_ze_driver_handle_t*>
                                 *)(context + 0x180),_total_driver_handle_count + local_54,&local_60
                               );
            _total_driver_handle_count[local_54] = (ze_driver_handle_t)poVar2;
          }
        }
        local_20 = driver_index + local_20;
      }
      else if (local_1c == ZE_RESULT_ERROR_UNINITIALIZED) {
        _i->initStatus = ZE_RESULT_ERROR_UNINITIALIZED;
      }
    }
    __gnu_cxx::
    __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
    ::operator++(&__end1);
  }
  if ((local_1c == ZE_RESULT_SUCCESS) || (local_20 != 0)) {
    *(uint *)phDrivers_local = local_20;
  }
  if (local_20 != 0) {
    local_1c = ZE_RESULT_SUCCESS;
  }
  return local_1c;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDriverGet(
        uint32_t* pCount,                               ///< [in,out] pointer to the number of driver instances.
                                                        ///< if count is zero, then the loader shall update the value with the
                                                        ///< total number of drivers available.
                                                        ///< if count is greater than the number of drivers available, then the
                                                        ///< loader shall update the value with the correct number of drivers available.
        ze_driver_handle_t* phDrivers                   ///< [in,out][optional][range(0, *pCount)] array of driver instance handles.
                                                        ///< if count is less than the number of drivers available, then the loader
                                                        ///< shall only retrieve that number of drivers.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        uint32_t total_driver_handle_count = 0;

        if (!loader::context->sortingInProgress.exchange(true) && !loader::context->instrumentationEnabled) {
            std::call_once(loader::context->coreDriverSortOnce, []() {
                loader::context->driverSorting(&loader::context->zeDrivers, nullptr, false);
            });
            loader::context->sortingInProgress.store(false);
        }

        for( auto& drv : loader::context->zeDrivers )
        {
            if(drv.initStatus != ZE_RESULT_SUCCESS)
                continue;

            if( ( 0 < *pCount ) && ( *pCount == total_driver_handle_count))
                break;

            uint32_t library_driver_handle_count = 0;

            result = drv.dditable.ze.Driver.pfnGet( &library_driver_handle_count, nullptr );
            if( ZE_RESULT_SUCCESS != result ) {
                // If Get Drivers fails with Uninitialized, then update the driver init status to prevent reporting this driver in the next get call.
                if (ZE_RESULT_ERROR_UNINITIALIZED == result) {
                    drv.initStatus = result;
                }
                continue;
            }

            if( nullptr != phDrivers && *pCount !=0)
            {
                if( total_driver_handle_count + library_driver_handle_count > *pCount) {
                    library_driver_handle_count = *pCount - total_driver_handle_count;
                }
                result = drv.dditable.ze.Driver.pfnGet( &library_driver_handle_count, &phDrivers[ total_driver_handle_count ] );
                if( ZE_RESULT_SUCCESS != result ) break;

                drv.driverInuse = true;

                try
                {
                    for( uint32_t i = 0; i < library_driver_handle_count; ++i ) {
                        uint32_t driver_index = total_driver_handle_count + i;
                        phDrivers[ driver_index ] = reinterpret_cast<ze_driver_handle_t>(
                            context->ze_driver_factory.getInstance( phDrivers[ driver_index ], &drv.dditable ) );
                    }
                }
                catch( std::bad_alloc& )
                {
                    result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
                }
            }

            total_driver_handle_count += library_driver_handle_count;
        }

        // If the last driver get failed, but at least one driver succeeded, then return success with total count.
        if( ZE_RESULT_SUCCESS == result || total_driver_handle_count > 0)
            *pCount = total_driver_handle_count;
        if (total_driver_handle_count > 0) {
            result = ZE_RESULT_SUCCESS;
        }

        return result;
    }